

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O1

int main_sqrtAddcbrt(void)

{
  double dVar1;
  int iVar2;
  ostream *poVar3;
  ulong uVar4;
  double dVar5;
  initializer_list<double> __l;
  initializer_list<double> __l_00;
  vector<double,_std::allocator<double>_> data;
  vector<double,_std::allocator<double>_> output;
  FC_BPNN bp;
  double local_120;
  double local_118;
  allocator_type local_10a;
  allocator_type local_109;
  vector<double,_std::allocator<double>_> local_108;
  vector<double,_std::allocator<double>_> local_e8;
  double local_d0;
  double local_c8;
  double local_c0;
  vector<double,_std::allocator<double>_> local_b8;
  vector<double,_std::allocator<double>_> local_a0;
  double local_88;
  double local_80;
  FC_BPNN local_78;
  
  FC_BPNN::FC_BPNN(&local_78,2,6,7,1);
  local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (double *)0x0;
  local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (double *)0x0;
  local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (double *)0x0;
  local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x3fd010624dd2f1aa;
  std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
            (&local_108,(iterator)0x0,(double *)&local_e8);
  local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x3f9c0ebedfa43fe6;
  if (local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish ==
      local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
              (&local_108,
               (iterator)
               local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish,(double *)&local_e8);
  }
  else {
    *local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
     _M_finish = 0.0274;
    local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish + 1;
  }
  local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (double *)0x0;
  local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  uVar4 = 1;
  local_d0 = 0.0;
  local_118 = 0.0;
  do {
    iVar2 = rand();
    dVar5 = (double)(iVar2 % 1000) / 1000.0;
    iVar2 = rand();
    local_c8 = (double)(iVar2 % 1000) / 1000.0;
    __l._M_len = 2;
    __l._M_array = &local_88;
    local_88 = dVar5;
    local_80 = local_c8;
    std::vector<double,_std::allocator<double>_>::vector(&local_a0,__l,&local_109);
    if (dVar5 < 0.0) {
      dVar5 = sqrt(dVar5);
    }
    else {
      dVar5 = SQRT(dVar5);
    }
    local_c0 = cbrt(local_c8);
    local_c0 = local_c0 + dVar5;
    __l_00._M_len = 1;
    __l_00._M_array = &local_c0;
    std::vector<double,_std::allocator<double>_>::vector(&local_b8,__l_00,&local_10a);
    local_120 = FC_BPNN::train_once(&local_78,&local_a0,&local_b8);
    if (local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start != (pointer)0x0) {
      operator_delete(local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_a0.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start != (pointer)0x0) {
      operator_delete(local_a0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_a0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_a0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    iVar2 = (int)uVar4;
    local_120 = local_118 + local_120;
    if ((int)(uVar4 / 100) * -100 + 1 + iVar2 == 1) {
      local_118 = local_120 / 100.0;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"iter: ",6);
      poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," cost: ",7);
      poVar3 = std::ostream::_M_insert<double>(local_118);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," step: ",7);
      dVar5 = FC_BPNN::getLearningStep(&local_78);
      poVar3 = std::ostream::_M_insert<double>(dVar5);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
      std::ostream::put((char)poVar3);
      std::ostream::flush();
      local_120 = 0.0;
      if ((local_d0 - local_118) / local_d0 <= 0.1) {
        dVar5 = FC_BPNN::getLearningStep(&local_78);
        FC_BPNN::setLearningStep(&local_78,dVar5 * 0.5);
      }
    }
    else {
      local_118 = local_d0;
    }
    uVar4 = (ulong)(iVar2 + 1U);
    local_d0 = local_118;
    local_118 = local_120;
  } while (iVar2 + 1U != 0x3e9);
  FC_BPNN::predict(&local_78,&local_108,&local_e8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"prediction: ",0xc);
  poVar3 = std::ostream::_M_insert<double>
                     (*local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," gt: ",5);
  dVar5 = *local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  dVar1 = local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[1];
  if (dVar5 < 0.0) {
    dVar5 = sqrt(dVar5);
  }
  else {
    dVar5 = SQRT(dVar5);
  }
  dVar1 = cbrt(dVar1);
  poVar3 = std::ostream::_M_insert<double>(dVar1 + dVar5);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  if (local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (double *)0x0) {
    operator_delete(local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (double *)0x0) {
    operator_delete(local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  FC_BPNN::~FC_BPNN(&local_78);
  return 1;
}

Assistant:

int main_sqrtAddcbrt() {
	FC_BPNN bp(2, 6, 7, 1);
	std::vector<double> data; data.push_back(0.251); data.push_back(0.0274);
	std::vector<double> output;
	double lastCost = 0.0; double cost = 0.0;
	for (int i = 1; i <= 1000; i++) {
		double a = (double)(rand() % 1000) / 1000;
		double b = (double)(rand() % 1000) / 1000;
		cost += bp.train_once({ a ,b }, { square_root_add_cube_root(a,b) });
		if (i % 100 == 0) {
			cost /= 100;
			std::cout << "iter: " << i << " cost: " << cost << " step: " << bp.getLearningStep() << std::endl;
			double costRate = (lastCost - cost) / lastCost;
			if (costRate <= 0.1) {
				bp.setLearningStep(bp.getLearningStep() / 2);
			}
			lastCost = cost;
			cost = 0.0;
		}
	}
	bp.predict(data, output);
	std::cout << "prediction: " << output[0] << " gt: " << square_root_add_cube_root(data[0], data[1]) << std::endl;
	return 1;
}